

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fmt_helper.h
# Opt level: O1

void spdlog::details::fmt_helper::pad3<unsigned_int>(uint n,memory_buf_t *dest)

{
  size_t sVar1;
  uint32_or_64_or_128_t<unsigned_int> n_1;
  uint uVar2;
  ulong uVar3;
  char acStack_38 [21];
  char local_23 [3];
  char *local_20;
  
  if (n < 1000) {
    uVar2 = n % 100;
    uVar3 = (dest->super_buffer<char>).size_ + 1;
    if ((dest->super_buffer<char>).capacity_ < uVar3) {
      (*(dest->super_buffer<char>).grow_)(&dest->super_buffer<char>,uVar3);
    }
    sVar1 = (dest->super_buffer<char>).size_;
    (dest->super_buffer<char>).size_ = sVar1 + 1;
    (dest->super_buffer<char>).ptr_[sVar1] = (byte)(n / 100) | 0x30;
    uVar3 = (dest->super_buffer<char>).size_ + 1;
    if ((dest->super_buffer<char>).capacity_ < uVar3) {
      (*(dest->super_buffer<char>).grow_)(&dest->super_buffer<char>,uVar3);
    }
    sVar1 = (dest->super_buffer<char>).size_;
    (dest->super_buffer<char>).size_ = sVar1 + 1;
    (dest->super_buffer<char>).ptr_[sVar1] = (byte)(uVar2 / 10) | 0x30;
    uVar3 = (dest->super_buffer<char>).size_ + 1;
    if ((dest->super_buffer<char>).capacity_ < uVar3) {
      (*(dest->super_buffer<char>).grow_)(&dest->super_buffer<char>,uVar3);
    }
    sVar1 = (dest->super_buffer<char>).size_;
    (dest->super_buffer<char>).size_ = sVar1 + 1;
    (dest->super_buffer<char>).ptr_[sVar1] = (char)uVar2 + (char)(uVar2 / 10) * -10 | 0x30;
  }
  else {
    local_20 = fmt::v11::detail::do_format_decimal<char,unsigned_int>(acStack_38,n,0x15);
    fmt::v11::detail::buffer<char>::append<char>(&dest->super_buffer<char>,local_20,local_23);
  }
  return;
}

Assistant:

inline void pad3(T n, memory_buf_t &dest) {
    static_assert(std::is_unsigned<T>::value, "pad3 must get unsigned T");
    if (n < 1000) {
        dest.push_back(static_cast<char>(n / 100 + '0'));
        n = n % 100;
        dest.push_back(static_cast<char>((n / 10) + '0'));
        dest.push_back(static_cast<char>((n % 10) + '0'));
    } else {
        append_int(n, dest);
    }
}